

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1ResizeHash(PCache1 *p)

{
  uint uVar1;
  PgHdr1 *pPVar2;
  ulong uVar3;
  PgHdr1 **ppPVar4;
  uint uVar5;
  ulong uVar6;
  PgHdr1 *pPVar7;
  
  uVar1 = p->nHash * 2;
  uVar5 = 0x100;
  if (0x100 < uVar1) {
    uVar5 = uVar1;
  }
  if ((p->nHash != 0) && (sqlite3Hooks_0 != (code *)0x0)) {
    (*sqlite3Hooks_0)();
  }
  ppPVar4 = (PgHdr1 **)sqlite3MallocZero((ulong)uVar5 << 3);
  if ((p->nHash != 0) && (sqlite3Hooks_1 != (code *)0x0)) {
    (*sqlite3Hooks_1)();
  }
  if (ppPVar4 != (PgHdr1 **)0x0) {
    uVar1 = p->nHash;
    for (uVar6 = 0; uVar6 != uVar1; uVar6 = uVar6 + 1) {
      pPVar7 = p->apHash[uVar6];
      while (pPVar7 != (PgHdr1 *)0x0) {
        uVar3 = (ulong)pPVar7->iKey % (ulong)uVar5;
        pPVar2 = pPVar7->pNext;
        pPVar7->pNext = ppPVar4[uVar3];
        ppPVar4[uVar3] = pPVar7;
        pPVar7 = pPVar2;
      }
    }
    sqlite3_free(p->apHash);
    p->apHash = ppPVar4;
    p->nHash = uVar5;
  }
  return;
}

Assistant:

static void pcache1ResizeHash(PCache1 *p){
  PgHdr1 **apNew;
  unsigned int nNew;
  unsigned int i;

  assert( sqlite3_mutex_held(p->pGroup->mutex) );

  nNew = p->nHash*2;
  if( nNew<256 ){
    nNew = 256;
  }

  pcache1LeaveMutex(p->pGroup);
  if( p->nHash ){ sqlite3BeginBenignMalloc(); }
  apNew = (PgHdr1 **)sqlite3MallocZero(sizeof(PgHdr1 *)*nNew);
  if( p->nHash ){ sqlite3EndBenignMalloc(); }
  pcache1EnterMutex(p->pGroup);
  if( apNew ){
    for(i=0; i<p->nHash; i++){
      PgHdr1 *pPage;
      PgHdr1 *pNext = p->apHash[i];
      while( (pPage = pNext)!=0 ){
        unsigned int h = pPage->iKey % nNew;
        pNext = pPage->pNext;
        pPage->pNext = apNew[h];
        apNew[h] = pPage;
      }
    }
    sqlite3_free(p->apHash);
    p->apHash = apNew;
    p->nHash = nNew;
  }
}